

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Oscs.cpp
# Opt level: O1

void __thiscall Gb_Square::clock_sweep(Gb_Square *this)

{
  byte bVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  
  pbVar2 = (this->super_Gb_Env).super_Gb_Osc.regs;
  bVar1 = *pbVar2 >> 4;
  if ((((bVar1 & 7) != 0) && (this->sweep_delay != 0)) &&
     (iVar4 = this->sweep_delay + -1, this->sweep_delay = iVar4, iVar4 == 0)) {
    this->sweep_delay = bVar1 & 7;
    pbVar2[3] = (byte)this->sweep_freq;
    puVar3 = (this->super_Gb_Env).super_Gb_Osc.regs;
    puVar3[4] = *(byte *)((long)&this->sweep_freq + 1) & 7 | puVar3[4] & 0xf8;
    bVar1 = *(this->super_Gb_Env).super_Gb_Osc.regs;
    iVar5 = this->sweep_freq >> (bVar1 & 7);
    iVar4 = -iVar5;
    if ((bVar1 & 8) == 0) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 + this->sweep_freq;
    this->sweep_freq = iVar4;
    if (iVar4 < 0) {
      iVar4 = 0;
    }
    else {
      if (iVar4 < 0x800) {
        return;
      }
      this->sweep_delay = 0;
      iVar4 = 0x800;
    }
    this->sweep_freq = iVar4;
    return;
  }
  return;
}

Assistant:

void Gb_Square::clock_sweep()
{
	int sweep_period = (regs [0] & period_mask) >> 4;
	if ( sweep_period && sweep_delay && !--sweep_delay )
	{
		sweep_delay = sweep_period;
		regs [3] = sweep_freq & 0xFF;
		regs [4] = (regs [4] & ~0x07) | (sweep_freq >> 8 & 0x07);
		
		int offset = sweep_freq >> (regs [0] & shift_mask);
		if ( regs [0] & 0x08 )
			offset = -offset;
		sweep_freq += offset;
		
		if ( sweep_freq < 0 )
		{
			sweep_freq = 0;
		}
		else if ( sweep_freq >= 2048 )
		{
			sweep_delay = 0; // don't modify channel frequency any further
			sweep_freq = 2048; // silence sound immediately
		}
	}
}